

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O2

MMAL_PARAM_AWBMODE_T __thiscall
raspicam::_private::Private_Impl::convertAWB(Private_Impl *this,RASPICAM_AWB awb)

{
  RASPICAM_AWB RVar1;
  
  RVar1 = RASPICAM_AWB_AUTO;
  if (awb < (RASPICAM_AWB_FLASH|RASPICAM_AWB_SUNLIGHT)) {
    RVar1 = awb;
  }
  return RVar1;
}

Assistant:

MMAL_PARAM_AWBMODE_T Private_Impl::convertAWB ( RASPICAM_AWB awb ) {
            switch ( awb ) {
            case RASPICAM_AWB_OFF:
                return MMAL_PARAM_AWBMODE_OFF;
            case RASPICAM_AWB_AUTO:
                return MMAL_PARAM_AWBMODE_AUTO;
            case RASPICAM_AWB_SUNLIGHT:
                return MMAL_PARAM_AWBMODE_SUNLIGHT;
            case RASPICAM_AWB_CLOUDY:
                return MMAL_PARAM_AWBMODE_CLOUDY;
            case RASPICAM_AWB_SHADE:
                return MMAL_PARAM_AWBMODE_SHADE;
            case RASPICAM_AWB_TUNGSTEN:
                return MMAL_PARAM_AWBMODE_TUNGSTEN;
            case RASPICAM_AWB_FLUORESCENT:
                return MMAL_PARAM_AWBMODE_FLUORESCENT;
            case RASPICAM_AWB_INCANDESCENT:
                return MMAL_PARAM_AWBMODE_INCANDESCENT;
            case RASPICAM_AWB_FLASH:
                return MMAL_PARAM_AWBMODE_FLASH;
            case RASPICAM_AWB_HORIZON:
                return MMAL_PARAM_AWBMODE_HORIZON;
            default:
                return MMAL_PARAM_AWBMODE_AUTO;
            }
        }